

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::LogDestination::SetLogFilenameExtension(char *ext)

{
  mutex *__mutex;
  string *__lhs;
  bool bVar1;
  LogDestination *pLVar2;
  undefined8 unaff_RBX;
  int iVar3;
  
  std::mutex::lock((mutex *)log_mutex);
  for (iVar3 = 0; iVar3 != 4; iVar3 = iVar3 + 1) {
    pLVar2 = log_destination((LogSeverity)((ulong)unaff_RBX >> 0x20));
    __mutex = &(pLVar2->fileobject_).mutex_;
    std::mutex::lock(__mutex);
    __lhs = &(pLVar2->fileobject_).filename_extension_;
    bVar1 = std::operator!=(__lhs,ext);
    if (bVar1) {
      if ((pLVar2->fileobject_).file_._M_t.
          super___uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_>._M_t.
          super__Tuple_impl<0UL,__IO_FILE_*,_std::default_delete<_IO_FILE>_>.
          super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl != (_IO_FILE *)0x0) {
        std::__uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_>::reset
                  ((__uniq_ptr_impl<_IO_FILE,_std::default_delete<_IO_FILE>_> *)
                   &(pLVar2->fileobject_).file_,(pointer)0x0);
        (pLVar2->fileobject_).rollover_attempt_ = 0x1f;
      }
      std::__cxx11::string::assign((char *)__lhs);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  pthread_mutex_unlock((pthread_mutex_t *)log_mutex);
  return;
}

Assistant:

inline void LogDestination::SetLogFilenameExtension(const char* ext) {
  // Prevent any subtle race conditions by wrapping a mutex lock around
  // all this stuff.
  std::lock_guard<std::mutex> l{log_mutex};
  for (int severity = 0; severity < NUM_SEVERITIES; ++severity) {
    log_destination(static_cast<LogSeverity>(severity))
        ->fileobject_.SetExtension(ext);
  }
}